

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

sysbvm_tuple_t sysbvm_wordArray_create(sysbvm_context_t *context,sysbvm_tuple_t slotCount)

{
  sysbvm_tuple_t sVar1;
  sysbvm_object_tuple_t *psVar2;
  sysbvm_type_tuple_t *wordArrayTypeObject;
  sysbvm_tuple_t slotCount_local;
  sysbvm_context_t *context_local;
  
  if ((slotCount == 0) && (sVar1 = (context->roots).wordArrayType, sVar1 != 0)) {
    if (*(long *)(sVar1 + 0x78) == 0) {
      psVar2 = sysbvm_context_allocateByteTuple(context,(context->roots).wordArrayType,0);
      *(sysbvm_object_tuple_t **)(sVar1 + 0x78) = psVar2;
    }
    context_local = *(sysbvm_context_t **)(sVar1 + 0x78);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_context_allocateByteTuple(context,(context->roots).wordArrayType,slotCount << 2);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_wordArray_create(sysbvm_context_t *context, sysbvm_tuple_t slotCount)
{
    if(slotCount == 0)
    {
        sysbvm_type_tuple_t *wordArrayTypeObject = (sysbvm_type_tuple_t*)context->roots.wordArrayType;
        if(wordArrayTypeObject)
        {
            if(!wordArrayTypeObject->emptyTrivialSingleton)
                wordArrayTypeObject->emptyTrivialSingleton = (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, context->roots.wordArrayType, 0);
            return wordArrayTypeObject->emptyTrivialSingleton;
        }
    }

    return (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, context->roots.wordArrayType, slotCount*4);
}